

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message_builder.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::MessageBuilderGenerator::MessageBuilderGenerator
          (MessageBuilderGenerator *this,Descriptor *descriptor,Context *context)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  ClassNameResolver *pCVar4;
  FileDescriptor *pFVar5;
  LogMessage *pLVar6;
  FieldDescriptor *pFVar7;
  OneofDescriptor *local_78;
  int local_70;
  LogFinisher local_6a;
  byte local_69;
  int i;
  Context *local_20;
  Context *context_local;
  Descriptor *descriptor_local;
  MessageBuilderGenerator *this_local;
  
  this->_vptr_MessageBuilderGenerator = (_func_int **)&PTR__MessageBuilderGenerator_008e7258;
  this->descriptor_ = descriptor;
  this->context_ = context;
  local_20 = context;
  context_local = (Context *)descriptor;
  descriptor_local = (Descriptor *)this;
  pCVar4 = Context::GetNameResolver(context);
  this->name_resolver_ = pCVar4;
  FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>::FieldGeneratorMap
            (&this->field_generators_,(Descriptor *)context_local,this->context_);
  std::
  set<const_google::protobuf::OneofDescriptor_*,_std::less<const_google::protobuf::OneofDescriptor_*>,_std::allocator<const_google::protobuf::OneofDescriptor_*>_>
  ::set(&this->oneofs_);
  local_69 = 0;
  pFVar5 = Descriptor::file((Descriptor *)context_local);
  bVar2 = Context::EnforceLite(local_20);
  bVar2 = HasDescriptorMethods(pFVar5,bVar2);
  if (!bVar2) {
    internal::LogMessage::LogMessage
              ((LogMessage *)&i,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/java/java_message_builder.cc"
               ,0x4c);
    local_69 = 1;
    pLVar6 = internal::LogMessage::operator<<
                       ((LogMessage *)&i,
                        "CHECK failed: HasDescriptorMethods(descriptor->file(), context->EnforceLite()): "
                       );
    pLVar6 = internal::LogMessage::operator<<
                       (pLVar6,
                        "Generator factory error: A non-lite message generator is used to generate lite messages."
                       );
    internal::LogFinisher::operator=(&local_6a,pLVar6);
  }
  if ((local_69 & 1) != 0) {
    internal::LogMessage::~LogMessage((LogMessage *)&i);
  }
  for (local_70 = 0; iVar1 = local_70, iVar3 = Descriptor::field_count(this->descriptor_),
      iVar1 < iVar3; local_70 = local_70 + 1) {
    pFVar7 = Descriptor::field(this->descriptor_,local_70);
    bVar2 = IsRealOneof(pFVar7);
    if (bVar2) {
      pFVar7 = Descriptor::field(this->descriptor_,local_70);
      local_78 = FieldDescriptor::containing_oneof(pFVar7);
      std::
      set<const_google::protobuf::OneofDescriptor_*,_std::less<const_google::protobuf::OneofDescriptor_*>,_std::allocator<const_google::protobuf::OneofDescriptor_*>_>
      ::insert(&this->oneofs_,&local_78);
    }
  }
  return;
}

Assistant:

MessageBuilderGenerator::MessageBuilderGenerator(const Descriptor* descriptor,
                                                 Context* context)
    : descriptor_(descriptor),
      context_(context),
      name_resolver_(context->GetNameResolver()),
      field_generators_(descriptor, context_) {
  GOOGLE_CHECK(HasDescriptorMethods(descriptor->file(), context->EnforceLite()))
      << "Generator factory error: A non-lite message generator is used to "
         "generate lite messages.";
  for (int i = 0; i < descriptor_->field_count(); i++) {
    if (IsRealOneof(descriptor_->field(i))) {
      oneofs_.insert(descriptor_->field(i)->containing_oneof());
    }
  }
}